

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_helpers.cpp
# Opt level: O2

optional<std::filesystem::perms> InterpretPermString(string *s)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0x100000000;
  bVar2 = std::operator==(s,"owner");
  uVar3 = 0x180;
  if (!bVar2) {
    bVar2 = std::operator==(s,"group");
    uVar3 = 0x1a0;
    if (!bVar2) {
      bVar2 = std::operator==(s,"all");
      if (!bVar2) {
        uVar4 = 0;
      }
      uVar3 = 0x1a4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (_Optional_base<std::filesystem::perms,_true,_true>)
           (_Optional_base<std::filesystem::perms,_true,_true>)(uVar4 | uVar3);
  }
  __stack_chk_fail();
}

Assistant:

std::optional<fs::perms> InterpretPermString(const std::string& s)
{
    if (s == "owner") {
        return fs::perms::owner_read | fs::perms::owner_write;
    } else if (s == "group") {
        return fs::perms::owner_read | fs::perms::owner_write |
               fs::perms::group_read;
    } else if (s == "all") {
        return fs::perms::owner_read | fs::perms::owner_write |
               fs::perms::group_read |
               fs::perms::others_read;
    } else {
        return std::nullopt;
    }
}